

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O3

matches * tabdesc(disctx *ctx,match m,atom *atoms)

{
  matches *pmVar1;
  matches *__ptr;
  matches *b;
  match *pmVar2;
  long lVar3;
  long lVar4;
  match *pmVar5;
  match *pmVar6;
  undefined8 *puVar7;
  byte bVar8;
  match in_stack_ffffffffffffff08;
  
  bVar8 = 0;
  if (atoms->fun == (afun)0x0) {
    __ptr = (matches *)calloc(0x10,1);
    __ptr->mmax = 0x10;
    pmVar2 = (match *)malloc(0xb80);
    __ptr->m = pmVar2;
    __ptr->mnum = 1;
    memcpy(pmVar2,&m,0xb8);
  }
  else {
    pmVar1 = (*atoms->fun)(ctx,(ull *)0x0,(ull *)0x0,atoms->arg,m.lpos);
    __ptr = (matches *)0x0;
    if (pmVar1 != (matches *)0x0) {
      pmVar2 = &m;
      puVar7 = (undefined8 *)&stack0xffffffffffffff08;
      for (lVar3 = 0x17; lVar3 != 0; lVar3 = lVar3 + -1) {
        *puVar7 = *(undefined8 *)pmVar2;
        pmVar2 = (match *)((long)pmVar2 + (ulong)bVar8 * -0x10 + 8);
        puVar7 = puVar7 + (ulong)bVar8 * -2 + 1;
      }
      __ptr = mergematches(in_stack_ffffffffffffff08,pmVar1);
      if (atoms[1].fun != (afun)0x0) {
        pmVar1 = (matches *)calloc(0x10,1);
        lVar3 = (long)__ptr->mnum;
        pmVar2 = __ptr->m;
        if (0 < lVar3) {
          pmVar5 = pmVar2;
          do {
            pmVar6 = pmVar5;
            puVar7 = (undefined8 *)&stack0xffffffffffffff08;
            for (lVar4 = 0x17; lVar4 != 0; lVar4 = lVar4 + -1) {
              *puVar7 = *(undefined8 *)pmVar6;
              pmVar6 = (match *)((long)pmVar6 + ((ulong)bVar8 * -2 + 1) * 8);
              puVar7 = puVar7 + (ulong)bVar8 * -2 + 1;
            }
            b = tabdesc(ctx,in_stack_ffffffffffffff08,atoms + 1);
            if (b != (matches *)0x0) {
              catmatches(pmVar1,b);
            }
            pmVar5 = pmVar5 + 1;
            lVar3 = lVar3 + -1;
          } while (lVar3 != 0);
        }
        free(pmVar2);
        free(__ptr);
        __ptr = pmVar1;
      }
    }
  }
  return __ptr;
}

Assistant:

struct matches *tabdesc (struct disctx *ctx, struct match m, const struct atom *atoms) {
	if (!atoms->fun) {
		struct matches *res = emptymatches();
		ADDARRAY(res->m, m);
		return res;
	}
	struct matches *ms = atoms->fun(ctx, 0, 0, atoms->arg, m.lpos);
	if (!ms)
		return 0;
	ms = mergematches(m, ms);
	atoms++;
	if (!atoms->fun)
		return ms;
	struct matches *res = emptymatches();
	int i;
	for (i = 0; i < ms->mnum; i++) {
		struct matches *tmp = tabdesc(ctx, ms->m[i], atoms);
		if (tmp)
			res = catmatches(res, tmp);
	}
	free(ms->m);
	free(ms);
	return res;
}